

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglNativeColorMappingTests.cpp
# Opt level: O0

void deqp::egl::anon_unknown_0::render(Functions *gl,deUint32 program,Vec4 *color)

{
  glUniform4fvFunc p_Var1;
  GLuint GVar2;
  GLenum GVar3;
  GLint GVar4;
  float *pfVar5;
  deUint32 colorLocation;
  deUint32 posLocation;
  float positions [12];
  Vec4 *color_local;
  deUint32 program_local;
  Functions *gl_local;
  
  memcpy(&colorLocation,&DAT_02b53420,0x30);
  (*gl->useProgram)(program);
  GVar2 = (*gl->getAttribLocation)(program,"a_pos");
  (*gl->enableVertexAttribArray)(GVar2);
  GVar3 = (*gl->getError)();
  glu::checkError(GVar3,"Failed to setup shader program for rendering",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNativeColorMappingTests.cpp"
                  ,0xee);
  GVar4 = (*gl->getUniformLocation)(program,"u_color");
  p_Var1 = gl->uniform4fv;
  pfVar5 = tcu::Vector<float,_4>::getPtr(color);
  (*p_Var1)(GVar4,1,pfVar5);
  (*gl->vertexAttribPointer)(GVar2,2,0x1406,'\0',0,&colorLocation);
  (*gl->drawArrays)(4,0,6);
  GVar3 = (*gl->getError)();
  glu::checkError(GVar3,"Failed to render",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNativeColorMappingTests.cpp"
                  ,0xf5);
  return;
}

Assistant:

void render (const glw::Functions& gl, deUint32 program, const tcu::Vec4& color)
{
	const float positions[] =
	{
		-1.0f, -1.0f,
		 1.0f, -1.0f,
		 1.0f,  1.0f,

		 1.0f,  1.0f,
		-1.0f,  1.0f,
		-1.0f, -1.0f
	};

	deUint32 posLocation;
	deUint32 colorLocation;

	gl.useProgram(program);
	posLocation	= gl.getAttribLocation(program, "a_pos");
	gl.enableVertexAttribArray(posLocation);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to setup shader program for rendering");

	colorLocation = gl.getUniformLocation(program, "u_color");
	gl.uniform4fv(colorLocation, 1, color.getPtr());

	gl.vertexAttribPointer(posLocation, 2, GL_FLOAT, GL_FALSE, 0, positions);
	gl.drawArrays(GL_TRIANGLES, 0, 6);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to render");
}